

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FmtHelpers.cpp
# Opt level: O3

bool slang::ast::FmtHelpers::checkFinishNum(ASTContext *context,Expression *arg)

{
  logic_t lVar1;
  logic_t lVar2;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this;
  char cVar3;
  bool bVar4;
  char cVar5;
  ConstantValue cv;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_88;
  uint local_80;
  ushort local_7c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_78;
  uint local_70;
  ushort local_6c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_68;
  uint uStack_60;
  undefined1 uStack_5c;
  byte bStack_5b;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  ASTContext::tryEval((ConstantValue *)&local_58,context,arg);
  if (local_58._M_index == '\x01') {
    this = std::
           get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                     ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_58);
    bStack_5b = 0;
    local_68.val._0_6_ = 0;
    local_68.val._6_2_ = 0;
    uStack_5c = 1;
    uStack_60 = 1;
    SVInt::clearUnusedBits((SVInt *)&local_68);
    lVar1 = SVInt::operator==(this,(SVInt *)&local_68);
    local_78.val = 1;
    local_6c = 1;
    local_70 = 2;
    SVInt::clearUnusedBits((SVInt *)&local_78);
    lVar2 = SVInt::operator==(this,(SVInt *)&local_78);
    cVar5 = -0x80;
    if (lVar2.value == '\0' && lVar1.value == '\0') {
      cVar5 = '\0';
    }
    if (lVar2.value == '\x01') {
      cVar5 = '\x01';
    }
    if (lVar1.value == '\x01') {
      cVar5 = '\x01';
    }
    local_88.val = 2;
    local_7c = 1;
    local_80 = 3;
    SVInt::clearUnusedBits((SVInt *)&local_88);
    lVar1 = SVInt::operator==(this,(SVInt *)&local_88);
    cVar3 = '\0';
    if (lVar1.value != '\0' || cVar5 != '\0') {
      cVar3 = -0x80;
    }
    if (lVar1.value == '\x01') {
      cVar3 = '\x01';
    }
    if (cVar5 == '\x01') {
      cVar3 = '\x01';
    }
    if (((0x40 < local_80) || ((local_7c & 0x100) != 0)) && ((void *)local_88.val != (void *)0x0)) {
      operator_delete__(local_88.pVal);
    }
    if (((0x40 < local_70) || ((local_6c & 0x100) != 0)) && ((void *)local_78.val != (void *)0x0)) {
      operator_delete__(local_78.pVal);
    }
    if (((0x40 < uStack_60) || ((bStack_5b & 1) != 0)) &&
       ((void *)CONCAT26(local_68.val._6_2_,local_68.val._0_6_) != (void *)0x0)) {
      operator_delete__((void *)CONCAT26(local_68.val._6_2_,local_68.val._0_6_));
    }
    bVar4 = true;
    if (cVar3 != '\0' && (cVar3 != -0x80 && cVar3 != '@')) goto LAB_003287dc;
  }
  ASTContext::addDiag(context,(DiagCode)0x2b000b,arg->sourceRange);
  bVar4 = false;
LAB_003287dc:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_58);
  return bVar4;
}

Assistant:

bool FmtHelpers::checkFinishNum(const ASTContext& context, const Expression& arg) {
    ConstantValue cv = context.tryEval(arg);
    if (cv.isInteger()) {
        auto& val = cv.integer();
        if (val == 0 || val == 1 || val == 2)
            return true;
    }

    context.addDiag(diag::BadFinishNum, arg.sourceRange);
    return false;
}